

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_mthc0_entrylo(TCGContext_conflict6 *tcg_ctx,TCGv_i64 arg,target_ulong off)

{
  TCGTemp *a1;
  TCGTemp *ts;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i64 arg2;
  
  a1 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
  arg2 = (TCGv_i64)((long)a1 - (long)tcg_ctx);
  ts = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
  if (arg2 != arg) {
    tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_mov_i64,(TCGArg)a1,(TCGArg)(arg + (long)tcg_ctx));
  }
  tcg_gen_op3_mips64el
            (tcg_ctx,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),off);
  tcg_gen_deposit_i64_mips64el
            (tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),(TCGv_i64)((long)ts - (long)tcg_ctx),arg2,
             0x1e,0x20);
  tcg_gen_op3_mips64el
            (tcg_ctx,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),off);
  tcg_temp_free_internal_mips64el(tcg_ctx,ts);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_mthc0_entrylo(TCGContext *tcg_ctx, TCGv arg, target_ulong off)
{
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_ext_tl_i64(tcg_ctx, t0, arg);
    tcg_gen_ld_i64(tcg_ctx, t1, tcg_ctx->cpu_env, off);
#if defined(TARGET_MIPS64)
    tcg_gen_deposit_i64(tcg_ctx, t1, t1, t0, 30, 32);
#else
    tcg_gen_concat32_i64(tcg_ctx, t1, t1, t0);
#endif
    tcg_gen_st_i64(tcg_ctx, t1, tcg_ctx->cpu_env, off);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t0);
}